

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O2

void prngEchoStepR(void *buf,size_t count,void *state)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  
  for (sVar1 = 0; count != sVar1; sVar1 = sVar1 + 1) {
    *(undefined1 *)((long)buf + sVar1) = *(undefined1 *)(*state + *(long *)((long)state + 0x10));
    lVar2 = *(long *)((long)state + 0x10) + 1;
    lVar3 = 0;
    if (lVar2 != *(long *)((long)state + 8)) {
      lVar3 = lVar2;
    }
    *(long *)((long)state + 0x10) = lVar3;
  }
  return;
}

Assistant:

void prngEchoStepR(void* buf, size_t count, void* state)
{
	prng_echo_st* s = (prng_echo_st*)state;
	ASSERT(memIsValid(s, sizeof(prng_echo_st)));
	ASSERT(memIsValid(s->seed, s->seed_len));
	ASSERT(memIsValid(buf, count));
	// генерировать
	while (count--)
	{
		*((octet*)buf) = s->seed[s->pos];
		buf = (octet*)buf + 1;
		++s->pos;
		if (s->pos == s->seed_len)
			s->pos = 0;
	}
}